

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp.cpp
# Opt level: O1

void __thiscall Pathie::Tempfile::~Tempfile(Tempfile *this)

{
  Path *this_00;
  pointer pcVar1;
  bool bVar2;
  char *in_RSI;
  
  (this->super_TempEntry)._vptr_TempEntry = (_func_int **)&PTR__Tempfile_00113ce0;
  if ((this->super_TempEntry).m_keep == false) {
    this_00 = &(this->super_TempEntry).m_path;
    bVar2 = Path::exists(this_00);
    if (bVar2) {
      Path::unlink(this_00,in_RSI);
    }
  }
  (this->super_TempEntry)._vptr_TempEntry = (_func_int **)&PTR__TempEntry_00113c90;
  pcVar1 = (this->super_TempEntry).m_path.m_path._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_TempEntry).m_path.m_path.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Tempfile::~Tempfile()
{
  if (!m_keep)
    remove();
}